

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

bool __thiscall
crnlib::mipmapped_texture::flip_y(mipmapped_texture *this,bool update_orientation_flags)

{
  orientation_flags_t *poVar1;
  vector<crnlib::mip_level_*> *pvVar2;
  mip_level **ppmVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  mipmapped_texture temp_tex;
  mipmapped_texture local_60;
  
  mipmapped_texture(&local_60,this);
  bVar4 = flip_y_helper(&local_60);
  if (!bVar4) {
    operator=(&local_60,this);
    unpack_from_dxt(&local_60,false);
    bVar4 = flip_y_helper(&local_60);
    if (!bVar4) {
      bVar4 = false;
      goto LAB_0013628c;
    }
  }
  swap(this,&local_60);
  bVar4 = true;
  if ((update_orientation_flags) && (uVar5 = (ulong)(this->m_faces).m_size, uVar5 != 0)) {
    pvVar2 = (this->m_faces).m_p;
    uVar6 = 0;
    do {
      uVar7 = (ulong)pvVar2[uVar6].m_size;
      if (uVar7 != 0) {
        ppmVar3 = pvVar2[uVar6].m_p;
        uVar8 = 0;
        do {
          poVar1 = &ppmVar3[uVar8]->m_orient_flags;
          *poVar1 = *poVar1 ^ cOrientationFlagYFlipped;
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar5);
  }
LAB_0013628c:
  ~mipmapped_texture(&local_60);
  return bVar4;
}

Assistant:

bool mipmapped_texture::flip_y(bool update_orientation_flags) {
  mipmapped_texture temp_tex(*this);
  if (!temp_tex.flip_y_helper()) {
    temp_tex = *this;
    temp_tex.unpack_from_dxt(true);
    if (!temp_tex.flip_y_helper())
      return false;
  }
  swap(temp_tex);

  if (update_orientation_flags) {
    for (uint f = 0; f < get_num_faces(); f++) {
      for (uint m = 0; m < get_face(f).size(); m++) {
        uint orient_flags = get_face(f)[m]->get_orientation_flags();
        orient_flags ^= cOrientationFlagYFlipped;
        get_face(f)[m]->set_orientation_flags(static_cast<orientation_flags_t>(orient_flags));
      }
    }
  }

  CRNLIB_ASSERT(check());

  return true;
}